

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_space_time_stack.cpp
# Opt level: O1

Space KokkosTools::SpaceTimeStack::get_space(SpaceHandle *handle)

{
  if (*(int *)handle->name == 0x61647543) {
    return SPACE_CUDA;
  }
  if (*(int *)handle->name == 0x4c435953) {
    return SPACE_SYCL;
  }
  if (*(int *)(handle->name + 8) == 0x74656772 && *(long *)handle->name == 0x6154504d6e65704f) {
    return SPACE_OMPT;
  }
  if (handle->name[2] != 'P' || *(short *)handle->name != 0x4948) {
    if (handle->name[4] == '\0' && *(int *)handle->name == 0x74736f48) {
      return SPACE_HOST;
    }
    abort();
  }
  return SPACE_HIP;
}

Assistant:

Space get_space(SpaceHandle const& handle) {
  // check that name starts with "Cuda"
  if (strncmp(handle.name, "Cuda", 4) == 0) return SPACE_CUDA;
  // check that name starts with "SYCL"
  if (strncmp(handle.name, "SYCL", 4) == 0) return SPACE_SYCL;
  // check that name starts with "OpenMPTarget"
  if (strncmp(handle.name, "OpenMPTarget", 12) == 0) return SPACE_OMPT;
  // check that name starts with "HIP"
  if (strncmp(handle.name, "HIP", 3) == 0) return SPACE_HIP;
  if (strcmp(handle.name, "Host") == 0) return SPACE_HOST;

  abort();
  return SPACE_HOST;
}